

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecheck.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  allocator local_179;
  string local_178;
  string local_158;
  Scale local_138;
  KeyboardMapping local_b8;
  
  if (1 < argc) {
    uVar7 = 1;
    do {
      lVar3 = std::cout;
      *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x32;
      pcVar5 = argv[uVar7];
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(lVar3 + -0x18) + 0x10b158);
      }
      else {
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
      }
      pcVar5 = argv[uVar7];
      pcVar2 = strstr(pcVar5,".scl");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(pcVar5,".kbm");
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::string((string *)&local_178,pcVar5,&local_179);
          Tunings::readKBMFile(&local_b8,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8.name._M_dataplus._M_p != &local_b8.name.field_2) {
            operator_delete(local_b8.name._M_dataplus._M_p,
                            local_b8.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8.rawText._M_dataplus._M_p != &local_b8.rawText.field_2) {
            operator_delete(local_b8.rawText._M_dataplus._M_p,
                            local_b8.rawText.field_2._M_allocated_capacity + 1);
          }
          if (local_b8.keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b8.keys.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.keys.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar4 = local_178.field_2._M_allocated_capacity;
          _Var6._M_p = local_178._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00103782;
          goto LAB_0010378a;
        }
        lVar3 = 8;
        pcVar5 = " SKIPPED";
      }
      else {
        std::__cxx11::string::string((string *)&local_158,pcVar5,&local_179);
        Tunings::readSCLFile(&local_138,&local_158);
        std::vector<Tunings::Tone,_std::allocator<Tunings::Tone>_>::~vector(&local_138.tones);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.rawText._M_dataplus._M_p != &local_138.rawText.field_2) {
          operator_delete(local_138.rawText._M_dataplus._M_p,
                          local_138.rawText.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.description._M_dataplus._M_p != &local_138.description.field_2) {
          operator_delete(local_138.description._M_dataplus._M_p,
                          local_138.description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
          operator_delete(local_138.name._M_dataplus._M_p,
                          local_138.name.field_2._M_allocated_capacity + 1);
        }
        uVar4 = local_158.field_2._M_allocated_capacity;
        _Var6._M_p = local_158._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_00103782:
          operator_delete(_Var6._M_p,uVar4 + 1);
        }
LAB_0010378a:
        lVar3 = 7;
        pcVar5 = " PASSED";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    for (int i=1; i<argc; ++i)
    {
        std::cout << std::setw(50) << argv[i];
        try {
            if (strstr(argv[i], ".scl")) {
                Tunings::readSCLFile(argv[i]);
                std::cout << " PASSED";
            }
            else if (strstr(argv[i], ".kbm")) {
                Tunings::readKBMFile(argv[i]);
                std::cout << " PASSED";
            }
            else
            {
                std::cout << " SKIPPED";
            }

        } catch(Tunings::TuningError &t)
        {
            std::cout << " FAILED : " << t.what();
        }
        std::cout << std::endl;
    }
}